

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
          (CodedInputStream *this,uint64_t *value)

{
  uint64_t *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint8_t bytes [8];
  uint64_t local_18;
  
  puVar3 = &local_18;
  puVar1 = (uint64_t *)this->buffer_;
  if (*(int *)&this->buffer_end_ - (int)puVar1 < 8) {
    bVar2 = ReadRaw(this,&local_18,8);
    if (!bVar2) {
      return false;
    }
  }
  else {
    this->buffer_ = (uint8_t *)(puVar1 + 1);
    puVar3 = puVar1;
  }
  *value = *puVar3;
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian64Fallback(uint64_t* value) {
  constexpr size_t kSize = sizeof(*value);
  uint8_t bytes[kSize];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(kSize)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(kSize);
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, kSize)) return false;
    ptr = bytes;
  }
  ReadLittleEndian64FromArray(ptr, value);
  return true;
}